

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestEmptyBinaryDirectoryCommand.cxx
# Opt level: O2

bool __thiscall
cmCTestEmptyBinaryDirectoryCommand::InitialPass
          (cmCTestEmptyBinaryDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  ostringstream ostr;
  string local_1b0;
  string local_190 [11];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x20) {
    bVar2 = cmCTestScriptHandler::EmptyBinaryDirectory((pbVar1->_M_dataplus)._M_p);
    if (bVar2) {
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    poVar3 = std::operator<<((ostream *)local_190,"problem removing the binary directory: ");
    std::operator<<(poVar3,(string *)
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError((cmCommand *)this,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  }
  else {
    std::__cxx11::string::string
              ((string *)local_190,"called with incorrect number of arguments",
               (allocator *)&local_1b0);
    cmCommand::SetError((cmCommand *)this,local_190);
    std::__cxx11::string::~string((string *)local_190);
  }
  return false;
}

Assistant:

bool cmCTestEmptyBinaryDirectoryCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() != 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  if ( !cmCTestScriptHandler::EmptyBinaryDirectory(args[0].c_str()) )
    {
    std::ostringstream ostr;
    ostr << "problem removing the binary directory: " << args[0];
    this->SetError(ostr.str());
    return false;
    }

  return true;
}